

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::BackgroundCompaction(DBImpl *this)

{
  int iVar1;
  long lVar2;
  ManualCompaction *pMVar3;
  pointer ppFVar4;
  Logger *pLVar5;
  InternalKey *this_00;
  FileMetaData *pFVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  InternalKey *this_01;
  Status SVar9;
  bool bVar10;
  Compaction *this_02;
  char *pcVar11;
  CompactionState *compact;
  undefined8 uVar12;
  VersionEdit *this_03;
  _Alloc_hider _Var13;
  long in_FS_OFFSET;
  Status status;
  undefined1 local_120 [32];
  LevelSummaryStorage tmp;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  InternalKey manual_end;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->imm_ != (MemTable *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      CompactMemTable(this);
      return;
    }
    goto LAB_00a2ebb8;
  }
  pMVar3 = this->manual_compaction_;
  manual_end.rep_._M_dataplus._M_p = (pointer)&manual_end.rep_.field_2;
  manual_end.rep_._M_string_length = 0;
  manual_end.rep_.field_2._M_local_buf[0] = '\0';
  if (pMVar3 == (ManualCompaction *)0x0) {
    this_02 = VersionSet::PickCompaction(this->versions_);
    status.state_ = (char *)0x0;
    if (this_02 == (Compaction *)0x0) goto LAB_00a2e9c6;
    bVar10 = Compaction::IsTrivialMove(this_02);
    if (!bVar10) goto LAB_00a2e940;
    ppFVar4 = this_02->inputs_[0].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (((long)this_02->inputs_[0].
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 & 0x7fffffff8U) != 8) {
      __assert_fail("c->num_input_files(0) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                    ,0x2da,"void leveldb::DBImpl::BackgroundCompaction()");
    }
    pFVar6 = *ppFVar4;
    this_03 = &this_02->edit_;
    VersionEdit::DeleteFile(this_03,this_02->level_,pFVar6->number);
    VersionEdit::AddFile
              (this_03,this_02->level_ + 1,pFVar6->number,pFVar6->file_size,&pFVar6->smallest,
               &pFVar6->largest);
    VersionSet::LogAndApply((VersionSet *)&tmp,(VersionEdit *)this->versions_,(Mutex *)this_03);
    SVar9 = status;
    status.state_ = (char *)tmp.buffer._0_8_;
    tmp.buffer._0_8_ = SVar9.state_;
    Status::~Status((Status *)&tmp);
    if (status.state_ != (char *)0x0) {
      RecordBackgroundError(this,&status);
    }
    pLVar5 = (this->options_).info_log;
    uVar7 = pFVar6->number;
    uVar8 = pFVar6->file_size;
    iVar1 = this_02->level_;
    Status::ToString_abi_cxx11_((string *)local_78,&status);
    pcVar11 = VersionSet::LevelSummary(this->versions_,&tmp);
    Log(pLVar5,"Moved #%lld to level-%d %lld bytes %s: %s\n",uVar7,(ulong)(iVar1 + 1),uVar8,
        local_78[0]._M_allocated_capacity,pcVar11);
    std::__cxx11::string::~string((string *)local_78[0]._M_local_buf);
LAB_00a2e9bc:
    Compaction::~Compaction(this_02);
  }
  else {
    this_02 = VersionSet::CompactRange(this->versions_,pMVar3->level,pMVar3->begin,pMVar3->end);
    pMVar3->done = this_02 == (Compaction *)0x0;
    if (this_02 != (Compaction *)0x0) {
      ppFVar4 = this_02->inputs_[0].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&manual_end.rep_,
                 &(ppFVar4[((long)this_02->inputs_[0].
                                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4) *
                           0x20000000 + -0x100000000 >> 0x20]->largest).rep_);
    }
    pLVar5 = (this->options_).info_log;
    iVar1 = pMVar3->level;
    this_00 = pMVar3->begin;
    if (this_00 == (InternalKey *)0x0) {
      pcVar11 = "(begin)";
    }
    else {
      InternalKey::DebugString_abi_cxx11_((string *)&tmp,this_00);
      pcVar11 = (char *)tmp.buffer._0_8_;
    }
    this_01 = pMVar3->end;
    uVar12 = "(end)";
    if (this_01 != (InternalKey *)0x0) {
      InternalKey::DebugString_abi_cxx11_((string *)local_78,this_01);
      uVar12 = local_78[0]._M_allocated_capacity;
    }
    bVar10 = pMVar3->done;
    _Var13._M_p = "(end)";
    if (bVar10 == false) {
      InternalKey::DebugString_abi_cxx11_(&local_98,&manual_end);
      _Var13._M_p = local_98._M_dataplus._M_p;
    }
    Log(pLVar5,"Manual compaction at level-%d from %s .. %s; will stop at %s\n",iVar1,pcVar11,uVar12
        ,_Var13._M_p);
    if (bVar10 == false) {
      std::__cxx11::string::~string((string *)&local_98);
    }
    if (this_01 != (InternalKey *)0x0) {
      std::__cxx11::string::~string((string *)local_78[0]._M_local_buf);
    }
    if (this_00 != (InternalKey *)0x0) {
      std::__cxx11::string::~string((string *)&tmp);
    }
    status.state_ = (char *)0x0;
    if (this_02 != (Compaction *)0x0) {
LAB_00a2e940:
      compact = (CompactionState *)operator_new(0x40);
      compact->compaction = this_02;
      compact->smallest_snapshot = 0;
      (compact->outputs).
      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (compact->outputs).
      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (compact->outputs).
      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      compact->outfile = (WritableFile *)0x0;
      compact->builder = (TableBuilder *)0x0;
      compact->total_bytes = 0;
      DoCompactionWork((DBImpl *)local_120,(CompactionState *)this);
      SVar9 = status;
      status.state_ = (char *)local_120._0_8_;
      local_120._0_8_ = SVar9.state_;
      Status::~Status((Status *)local_120);
      if (status.state_ != (char *)0x0) {
        RecordBackgroundError(this,&status);
      }
      CleanupCompaction(this,compact);
      Compaction::ReleaseInputs(this_02);
      DeleteObsoleteFiles(this);
      goto LAB_00a2e9bc;
    }
LAB_00a2e9c6:
    status.state_ = (char *)0x0;
    this_02 = (Compaction *)0x0;
  }
  operator_delete(this_02,0x158);
  if ((status.state_ != (char *)0x0) && (((this->shutting_down_)._M_base._M_i & 1U) == 0)) {
    pLVar5 = (this->options_).info_log;
    Status::ToString_abi_cxx11_((string *)local_120,&status);
    Log(pLVar5,"Compaction error: %s",local_120._0_8_);
    std::__cxx11::string::~string((string *)local_120);
  }
  if (pMVar3 != (ManualCompaction *)0x0) {
    pMVar3 = this->manual_compaction_;
    if (status.state_ == (char *)0x0) {
      if ((pMVar3->done & 1U) == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&(pMVar3->tmp_storage).rep_,&manual_end.rep_);
        pMVar3->begin = &pMVar3->tmp_storage;
      }
    }
    else {
      pMVar3->done = true;
    }
    this->manual_compaction_ = (ManualCompaction *)0x0;
  }
  Status::~Status(&status);
  std::__cxx11::string::~string((string *)&manual_end);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_00a2ebb8:
  __stack_chk_fail();
}

Assistant:

void DBImpl::BackgroundCompaction() {
  mutex_.AssertHeld();

  if (imm_ != nullptr) {
    CompactMemTable();
    return;
  }

  Compaction* c;
  bool is_manual = (manual_compaction_ != nullptr);
  InternalKey manual_end;
  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    c = versions_->CompactRange(m->level, m->begin, m->end);
    m->done = (c == nullptr);
    if (c != nullptr) {
      manual_end = c->input(0, c->num_input_files(0) - 1)->largest;
    }
    Log(options_.info_log,
        "Manual compaction at level-%d from %s .. %s; will stop at %s\n",
        m->level, (m->begin ? m->begin->DebugString().c_str() : "(begin)"),
        (m->end ? m->end->DebugString().c_str() : "(end)"),
        (m->done ? "(end)" : manual_end.DebugString().c_str()));
  } else {
    c = versions_->PickCompaction();
  }

  Status status;
  if (c == nullptr) {
    // Nothing to do
  } else if (!is_manual && c->IsTrivialMove()) {
    // Move file to next level
    assert(c->num_input_files(0) == 1);
    FileMetaData* f = c->input(0, 0);
    c->edit()->DeleteFile(c->level(), f->number);
    c->edit()->AddFile(c->level() + 1, f->number, f->file_size, f->smallest,
                       f->largest);
    status = versions_->LogAndApply(c->edit(), &mutex_);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    VersionSet::LevelSummaryStorage tmp;
    Log(options_.info_log, "Moved #%lld to level-%d %lld bytes %s: %s\n",
        static_cast<unsigned long long>(f->number), c->level() + 1,
        static_cast<unsigned long long>(f->file_size),
        status.ToString().c_str(), versions_->LevelSummary(&tmp));
  } else {
    CompactionState* compact = new CompactionState(c);
    status = DoCompactionWork(compact);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    CleanupCompaction(compact);
    c->ReleaseInputs();
    DeleteObsoleteFiles();
  }
  delete c;

  if (status.ok()) {
    // Done
  } else if (shutting_down_.load(std::memory_order_acquire)) {
    // Ignore compaction errors found during shutting down
  } else {
    Log(options_.info_log, "Compaction error: %s", status.ToString().c_str());
  }

  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    if (!status.ok()) {
      m->done = true;
    }
    if (!m->done) {
      // We only compacted part of the requested range.  Update *m
      // to the range that is left to be compacted.
      m->tmp_storage = manual_end;
      m->begin = &m->tmp_storage;
    }
    manual_compaction_ = nullptr;
  }
}